

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall Diligent::GLContextState::SetCullMode(GLContextState *this,CULL_MODE CullMode)

{
  Char *pCVar1;
  undefined1 local_b8 [8];
  string msg_3;
  GLenum err_2;
  GLenum CullFace;
  string msg_2;
  undefined1 local_68 [4];
  GLenum err_1;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  GLenum err;
  CULL_MODE CullMode_local;
  GLContextState *this_local;
  
  if ((this->m_RSState).CullMode != CullMode) {
    msg.field_2._M_local_buf[0xf] = CullMode;
    if (CullMode == CULL_MODE_NONE) {
      glDisable();
      msg.field_2._8_4_ = glGetError();
      if (msg.field_2._8_4_ != 0) {
        LogError<false,char[31],char[17],unsigned_int>
                  (false,"SetCullMode",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x264,(char (*) [31])"Failed to disable face culling",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 8));
        FormatString<char[6]>((string *)local_38,(char (*) [6])0x4585f6);
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"SetCullMode",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x264);
        std::__cxx11::string::~string((string *)local_38);
      }
    }
    else {
      if ((CullMode != CULL_MODE_FRONT) && (CullMode != CULL_MODE_BACK)) {
        FormatString<char[21]>((string *)local_68,(char (*) [21])"Unexpected cull mode");
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"SetCullMode",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x268);
        std::__cxx11::string::~string((string *)local_68);
      }
      glEnable();
      msg_2.field_2._12_4_ = glGetError();
      if (msg_2.field_2._12_4_ != 0) {
        LogError<false,char[30],char[17],unsigned_int>
                  (false,"SetCullMode",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x26a,(char (*) [30])"Failed to enable face culling",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg_2.field_2._M_local_buf + 0xc));
        FormatString<char[6]>((string *)&err_2,(char (*) [6])0x4585f6);
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"SetCullMode",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x26a);
        std::__cxx11::string::~string((string *)&err_2);
      }
      msg_3.field_2._12_4_ = 0x404;
      if (msg.field_2._M_local_buf[0xf] == '\x03') {
        msg_3.field_2._12_4_ = 0x405;
      }
      glCullFace();
      msg_3.field_2._8_4_ = glGetError();
      if (msg_3.field_2._8_4_ != 0) {
        LogError<false,char[24],char[17],unsigned_int>
                  (false,"SetCullMode",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x26d,(char (*) [24])"Failed to set cull face",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg_3.field_2._M_local_buf + 8));
        FormatString<char[6]>((string *)local_b8,(char (*) [6])0x4585f6);
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"SetCullMode",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x26d);
        std::__cxx11::string::~string((string *)local_b8);
      }
    }
    (this->m_RSState).CullMode = msg.field_2._M_local_buf[0xf];
  }
  return;
}

Assistant:

void GLContextState::SetCullMode(CULL_MODE CullMode)
{
    if (m_RSState.CullMode != CullMode)
    {
        if (CullMode == CULL_MODE_NONE)
        {
            glDisable(GL_CULL_FACE);
            DEV_CHECK_GL_ERROR("Failed to disable face culling");
        }
        else
        {
            VERIFY(CullMode == CULL_MODE_FRONT || CullMode == CULL_MODE_BACK, "Unexpected cull mode");
            glEnable(GL_CULL_FACE);
            DEV_CHECK_GL_ERROR("Failed to enable face culling");
            GLenum CullFace = CullMode == CULL_MODE_BACK ? GL_BACK : GL_FRONT;
            glCullFace(CullFace);
            DEV_CHECK_GL_ERROR("Failed to set cull face");
        }

        m_RSState.CullMode = CullMode;
    }
}